

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O0

void * __thiscall glslang::TPoolAllocator::allocate(TPoolAllocator *this,size_t numBytes)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  tHeader *this_00;
  uchar *ret;
  tHeader *memory;
  tHeader *memory_2;
  size_t numBytesToAlloc;
  uchar *memory_1;
  size_t allocationSize;
  size_t numBytes_local;
  TPoolAllocator *this_local;
  
  sVar2 = TAllocation::allocationSize(numBytes);
  this->numCalls = this->numCalls + 1;
  this->totalBytes = numBytes + this->totalBytes;
  if (this->pageSize < this->currentPageOffset + sVar2) {
    if (this->pageSize < sVar2 + this->headerSkip) {
      uVar3 = sVar2 + this->headerSkip;
      this_00 = (tHeader *)operator_new__(uVar3);
      if (this_00 == (tHeader *)0x0) {
        this_local = (TPoolAllocator *)0x0;
      }
      else {
        tHeader::tHeader(this_00,this->inUseList,((uVar3 + this->pageSize) - 1) / this->pageSize);
        this->inUseList = this_00;
        this->currentPageOffset = this->pageSize;
        this_local = (TPoolAllocator *)((long)&this_00->lastAllocation + this->headerSkip);
      }
    }
    else {
      if (this->freeList == (tHeader *)0x0) {
        ret = (uchar *)operator_new__(this->pageSize);
        if (ret == (uchar *)0x0) {
          return (void *)0x0;
        }
      }
      else {
        ret = (uchar *)this->freeList;
        this->freeList = this->freeList->nextPage;
      }
      tHeader::tHeader((tHeader *)ret,this->inUseList,1);
      this->inUseList = (tHeader *)ret;
      this->currentPageOffset =
           this->headerSkip + sVar2 + this->alignmentMask &
           (this->alignmentMask ^ 0xffffffffffffffff);
      this_local = (TPoolAllocator *)
                   initializeAllocation
                             (this,this->inUseList,
                              (uchar *)((long)&this->inUseList->lastAllocation + this->headerSkip),
                              numBytes);
    }
  }
  else {
    sVar1 = this->currentPageOffset;
    this->currentPageOffset = sVar2 + this->currentPageOffset;
    this->currentPageOffset =
         this->currentPageOffset + this->alignmentMask & (this->alignmentMask ^ 0xffffffffffffffff);
    this_local = (TPoolAllocator *)
                 initializeAllocation
                           (this,this->inUseList,
                            (uchar *)((long)&this->inUseList->lastAllocation + sVar1),numBytes);
  }
  return this_local;
}

Assistant:

void* TPoolAllocator::allocate(size_t numBytes)
{
    // If we are using guard blocks, all allocations are bracketed by
    // them: [guardblock][allocation][guardblock].  numBytes is how
    // much memory the caller asked for.  allocationSize is the total
    // size including guard blocks.  In release build,
    // guardBlockSize=0 and this all gets optimized away.
    size_t allocationSize = TAllocation::allocationSize(numBytes);

    //
    // Just keep some interesting statistics.
    //
    ++numCalls;
    totalBytes += numBytes;

    //
    // Do the allocation, most likely case first, for efficiency.
    // This step could be moved to be inline sometime.
    //
    if (currentPageOffset + allocationSize <= pageSize) {
        //
        // Safe to allocate from currentPageOffset.
        //
        unsigned char* memory = reinterpret_cast<unsigned char*>(inUseList) + currentPageOffset;
        currentPageOffset += allocationSize;
        currentPageOffset = (currentPageOffset + alignmentMask) & ~alignmentMask;

        return initializeAllocation(inUseList, memory, numBytes);
    }

    if (allocationSize + headerSkip > pageSize) {
        //
        // Do a multi-page allocation.  Don't mix these with the others.
        // The OS is efficient and allocating and free-ing multiple pages.
        //
        size_t numBytesToAlloc = allocationSize + headerSkip;
        tHeader* memory = reinterpret_cast<tHeader*>(::new char[numBytesToAlloc]);
        if (memory == nullptr)
            return nullptr;

        // Use placement-new to initialize header
        new(memory) tHeader(inUseList, (numBytesToAlloc + pageSize - 1) / pageSize);
        inUseList = memory;

        currentPageOffset = pageSize;  // make next allocation come from a new page

        // No guard blocks for multi-page allocations (yet)
        return reinterpret_cast<void*>(reinterpret_cast<UINT_PTR>(memory) + headerSkip);
    }

    //
    // Need a simple page to allocate from.
    //
    tHeader* memory;
    if (freeList) {
        memory = freeList;
        freeList = freeList->nextPage;
    } else {
        memory = reinterpret_cast<tHeader*>(::new char[pageSize]);
        if (memory == nullptr)
            return nullptr;
    }

    // Use placement-new to initialize header
    new(memory) tHeader(inUseList, 1);
    inUseList = memory;

    unsigned char* ret = reinterpret_cast<unsigned char*>(inUseList) + headerSkip;
    currentPageOffset = (headerSkip + allocationSize + alignmentMask) & ~alignmentMask;

    return initializeAllocation(inUseList, ret, numBytes);
}